

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void do_supps(CHAR_DATA *ch,char *argument)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  CClass *pCVar8;
  char *pcVar9;
  char (*pacVar10) [4608];
  size_t sVar11;
  BUFFER *buffer;
  long lVar12;
  uint uVar13;
  skill_type *psVar14;
  char spell_columns [52];
  char buf [4608];
  char arg [4608];
  char spell_list [52] [4608];
  
  bVar3 = is_npc(ch);
  if (bVar3) {
    return;
  }
  pCVar8 = char_data::Class(ch);
  if ((pCVar8->ctype != 2) && (bVar3 = is_immortal(ch), !bVar3)) {
    send_to_char("Your class knows no prayers.\n\r",ch);
    return;
  }
  uVar13 = 1;
  uVar5 = 0x33;
  if ((*argument != '\0') && (bVar3 = str_prefix(argument,"all"), bVar3)) {
    pcVar9 = one_argument(argument,arg);
    bVar3 = is_number(arg);
    if (!bVar3) {
LAB_0032a6b4:
      pcVar9 = "Arguments must be numerical or all.\n\r";
      goto LAB_0032a6bb;
    }
    uVar4 = atoi(arg);
    if (uVar4 - 0x34 < 0xffffffcd) {
LAB_0032a3ed:
      pcVar9 = buf;
      sprintf(pcVar9,"Levels must be between 1 and %d.\n\r",0x33);
      goto LAB_0032a6bb;
    }
    uVar5 = uVar4;
    if (*pcVar9 != '\0') {
      one_argument(pcVar9,arg);
      bVar3 = is_number(arg);
      if (!bVar3) goto LAB_0032a6b4;
      uVar5 = atoi(arg);
      if (uVar5 - 0x34 < 0xffffffcd) goto LAB_0032a3ed;
      uVar13 = uVar4;
      if (uVar5 < uVar4) {
        pcVar9 = "That would be silly.\n\r";
        goto LAB_0032a6bb;
      }
    }
  }
  pacVar10 = spell_list;
  for (lVar12 = 0; lVar12 != 0x34; lVar12 = lVar12 + 1) {
    spell_columns[lVar12] = '\0';
    (*pacVar10)[0] = '\0';
    pacVar10 = pacVar10 + 1;
  }
  lVar12 = 0;
  bVar3 = false;
  for (psVar14 = skill_table; (lVar12 != 800 && (psVar14->name != (char *)0x0));
      psVar14 = psVar14 + 1) {
    pCVar8 = char_data::Class(ch);
    iVar6 = CClass::GetIndex(pCVar8);
    sVar2 = psVar14->skill_level[iVar6];
    if (((((int)sVar2 <= (int)uVar5) &&
         (((sVar2 < 0x34 && ((int)uVar13 <= (int)sVar2)) && (psVar14->spell_fun != spell_null)))) &&
        (0 < ch->pcdata->learned[lVar12])) && ((psVar14->ctype == 4 || (psVar14->ctype == 2)))) {
      pCVar8 = char_data::Class(ch);
      iVar6 = CClass::GetIndex(pCVar8);
      uVar4 = (uint)psVar14->skill_level[iVar6];
      if (ch->level < psVar14->skill_level[iVar6]) {
        sprintf(buf,"%-18s n/a      ",psVar14->name);
      }
      else {
        uVar7 = (uint)(100 / (long)(int)(((int)ch->level - uVar4) + 2));
        if ((int)uVar7 <= (int)psVar14->min_mana) {
          uVar7 = (int)psVar14->min_mana;
        }
        sprintf(buf,"%-18s  %3d mana  ",psVar14->name,(ulong)uVar7);
      }
      pacVar10 = spell_list + (int)uVar4;
      if ((*pacVar10)[0] == '\0') {
        sprintf(*pacVar10,"\n\rLevel %2d: %s",(ulong)uVar4,buf);
      }
      else {
        bVar1 = spell_columns[(int)uVar4];
        spell_columns[(int)uVar4] = bVar1 + 1;
        if ((bVar1 & 1) != 0) {
          sVar11 = strlen(*pacVar10);
          builtin_strncpy(*pacVar10 + sVar11,"\n\r      ",8);
          builtin_strncpy(spell_list[(int)uVar4] + sVar11 + 5,"       ",8);
        }
        strcat(*pacVar10,buf);
      }
      bVar3 = true;
    }
    lVar12 = lVar12 + 1;
  }
  if (bVar3) {
    buffer = new_buf();
    for (lVar12 = 0; lVar12 != 0x3a800; lVar12 = lVar12 + 0x1200) {
      if (spell_list[0][lVar12] != '\0') {
        add_buf(buffer,spell_list[0] + lVar12);
      }
    }
    add_buf(buffer,"\n\r");
    pcVar9 = buf_string(buffer);
    page_to_char(pcVar9,ch);
    free_buf(buffer);
    return;
  }
  pcVar9 = "No spells found.\n\r";
LAB_0032a6bb:
  send_to_char(pcVar9,ch);
  return;
}

Assistant:

void do_supps(CHAR_DATA *ch, char *argument)
{
	BUFFER *buffer;
	char arg[MAX_INPUT_LENGTH];
	char spell_list[LEVEL_HERO + 1][MAX_STRING_LENGTH];
	char spell_columns[LEVEL_HERO + 1];
	int sn, level, min_lev = 1, max_lev = LEVEL_HERO, mana;
	bool fAll= false, found= false;
	char buf[MAX_STRING_LENGTH];

	if (is_npc(ch))
		return;

	if (ch->Class()->ctype != CLASS_COMMUNER && !is_immortal(ch))
	{
		send_to_char("Your class knows no prayers.\n\r", ch);
		return;
	}

	if (argument[0] != '\0')
	{
		fAll = true;

		if (str_prefix(argument, "all"))
		{
			argument = one_argument(argument, arg);

			if (!is_number(arg))
			{
				send_to_char("Arguments must be numerical or all.\n\r", ch);
				return;
			}

			max_lev = atoi(arg);

			if (max_lev < 1 || max_lev > LEVEL_HERO)
			{
				sprintf(buf, "Levels must be between 1 and %d.\n\r", LEVEL_HERO);
				send_to_char(buf, ch);
				return;
			}

			if (argument[0] != '\0')
			{
				argument = one_argument(argument, arg);
				if (!is_number(arg))
				{
					send_to_char("Arguments must be numerical or all.\n\r", ch);
					return;
				}

				min_lev = max_lev;
				max_lev = atoi(arg);

				if (max_lev < 1 || max_lev > LEVEL_HERO)
				{
					sprintf(buf, "Levels must be between 1 and %d.\n\r", LEVEL_HERO);
					send_to_char(buf, ch);
					return;
				}

				if (min_lev > max_lev)
				{
					send_to_char("That would be silly.\n\r", ch);
					return;
				}
			}
		}
	}

	/* initialize data */
	for (level = 0; level < LEVEL_HERO + 1; level++)
	{
		spell_columns[level] = 0;
		spell_list[level][0] = '\0';
	}

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (skill_table[sn].name == nullptr)
			break;

		level = skill_table[sn].skill_level[ch->Class()->GetIndex()];

		if (level < LEVEL_HERO + 1
			&& level >= min_lev
			&& level <= max_lev
			&& skill_table[sn].spell_fun != spell_null
			&& ch->pcdata->learned[sn] > 0
			&& (skill_table[sn].ctype == CMD_COMMUNE || skill_table[sn].ctype == CMD_BOTH))
		{
			found = true;
			level = skill_table[sn].skill_level[ch->Class()->GetIndex()];

			if (ch->level < level)
			{
				sprintf(buf, "%-18s n/a      ", skill_table[sn].name);
			}
			else
			{
				mana = std::max((int)skill_table[sn].min_mana, 100 / (2 + ch->level - level));
				sprintf(buf, "%-18s  %3d mana  ", skill_table[sn].name, mana);
			}

			if (spell_list[level][0] == '\0')
			{
				sprintf(spell_list[level], "\n\rLevel %2d: %s", level, buf);
			}
			else /* append */
			{
				if (++spell_columns[level] % 2 == 0)
					strcat(spell_list[level], "\n\r          ");

				strcat(spell_list[level], buf);
			}
		}
	}

	/* return results */

	if (!found)
	{
		send_to_char("No spells found.\n\r", ch);
		return;
	}

	buffer = new_buf();

	for (level = 0; level < LEVEL_HERO + 1; level++)
	{
		if (spell_list[level][0] != '\0')
			add_buf(buffer, spell_list[level]);
	}

	add_buf(buffer, "\n\r");
	page_to_char(buf_string(buffer), ch);
	free_buf(buffer);
}